

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

void __thiscall
vkt::api::anon_unknown_1::GraphicsPipeline::Resources::Resources
          (Resources *this,Environment *env,Parameters *param_2)

{
  Parameters *pPVar1;
  Parameters local_11a;
  Parameters local_119;
  Parameters local_118;
  Parameters local_100;
  allocator<char> local_c9;
  string local_c8;
  Parameters local_a8;
  allocator<char> local_69;
  string local_68;
  Parameters local_48;
  Parameters *local_20;
  Parameters *param_2_local;
  Environment *env_local;
  Resources *this_local;
  
  local_20 = param_2;
  param_2_local = (Parameters *)env;
  env_local = (Environment *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"vert",&local_69);
  ShaderModule::Parameters::Parameters(&local_48,VK_SHADER_STAGE_VERTEX_BIT,&local_68);
  Dependency<vkt::api::(anonymous_namespace)::ShaderModule>::Dependency
            (&this->vertexShader,env,&local_48);
  ShaderModule::Parameters::~Parameters(&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  pPVar1 = param_2_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"frag",&local_c9);
  ShaderModule::Parameters::Parameters(&local_a8,VK_SHADER_STAGE_FRAGMENT_BIT,&local_c8);
  Dependency<vkt::api::(anonymous_namespace)::ShaderModule>::Dependency
            (&this->fragmentShader,(Environment *)pPVar1,&local_a8);
  ShaderModule::Parameters::~Parameters(&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  pPVar1 = param_2_local;
  DescriptorSetLayout::Parameters::single
            (&local_118,0,VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,1,0x10,true);
  PipelineLayout::Parameters::singleDescriptorSet(&local_100,&local_118);
  Dependency<vkt::api::(anonymous_namespace)::PipelineLayout>::Dependency
            (&this->layout,(Environment *)pPVar1,&local_100);
  PipelineLayout::Parameters::~Parameters(&local_100);
  DescriptorSetLayout::Parameters::~Parameters(&local_118);
  pPVar1 = param_2_local;
  RenderPass::Parameters::Parameters(&local_119);
  Dependency<vkt::api::(anonymous_namespace)::RenderPass>::Dependency
            (&this->renderPass,(Environment *)pPVar1,&local_119);
  pPVar1 = param_2_local;
  PipelineCache::Parameters::Parameters(&local_11a);
  Dependency<vkt::api::(anonymous_namespace)::PipelineCache>::Dependency
            (&this->pipelineCache,(Environment *)pPVar1,&local_11a);
  return;
}

Assistant:

Resources (const Environment& env, const Parameters&)
			: vertexShader		(env, ShaderModule::Parameters(VK_SHADER_STAGE_VERTEX_BIT, "vert"))
			, fragmentShader	(env, ShaderModule::Parameters(VK_SHADER_STAGE_FRAGMENT_BIT, "frag"))
			, layout			(env, PipelineLayout::Parameters::singleDescriptorSet(
										DescriptorSetLayout::Parameters::single(0u, VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, 1u, VK_SHADER_STAGE_FRAGMENT_BIT, true)))
			, renderPass		(env, RenderPass::Parameters())
			, pipelineCache		(env, PipelineCache::Parameters())
		{}